

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_0::UniformValueSamplerCase::test
          (UniformValueSamplerCase *this)

{
  TestContext *testCtx;
  char *pcVar1;
  bool bVar2;
  deUint32 dVar3;
  GLint location_00;
  RenderContext *renderCtx;
  GLint location;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  UniformValueSamplerCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  renderCtx = gles2::Context::getRenderContext((this->super_ApiCase).super_TestCase.m_context);
  pcVar1 = test::testVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,pcVar1,&local_1d1);
  pcVar1 = test::testFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,pcVar1,(allocator<char> *)((long)&location + 3));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)((long)&location + 3));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (bVar2) {
    dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,dVar3);
    ApiCase::expectError(&this->super_ApiCase,0);
    dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    location_00 = glu::CallLogWrapper::glGetUniformLocation
                            (&(this->super_ApiCase).super_CallLogWrapper,dVar3,"uniformSampler");
    glu::CallLogWrapper::glUniform1i(&(this->super_ApiCase).super_CallLogWrapper,location_00,1);
    testCtx = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
    verifyUniformValue1i(testCtx,&(this->super_ApiCase).super_CallLogWrapper,dVar3,location_00,1);
    glu::CallLogWrapper::glUseProgram(&(this->super_ApiCase).super_CallLogWrapper,0);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  else {
    glu::operator<<((this->super_ApiCase).m_log,(ShaderProgram *)local_e0);
    tcu::TestContext::setTestResult
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Failed to compile shader");
  }
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void test (void)
	{
		static const char* testVertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n";
		static const char* testFragSource =
			"uniform highp sampler2D uniformSampler;\n"

			"void main (void)\n"
			"{\n"
			"	gl_FragColor = vec4(texture2D(uniformSampler, vec2(0.0, 0.0)).x);\n"
			"}\n";

		glu::ShaderProgram program(m_context.getRenderContext(), glu::makeVtxFragSources(testVertSource, testFragSource));
		if (!program.isOk())
		{
			m_log << program;
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to compile shader");
			return;
		}

		glUseProgram(program.getProgram());
		expectError(GL_NO_ERROR);

		GLint location;

		location = glGetUniformLocation(program.getProgram(), "uniformSampler");
		glUniform1i(location, 1);
		verifyUniformValue1i(m_testCtx, *this, program.getProgram(), location, 1);

		glUseProgram(0);
		expectError(GL_NO_ERROR);
	}